

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

void __thiscall Uniforms::set(Uniforms *this,string *_name,float _x,float _y,float _z)

{
  mapped_type *this_00;
  UniformValue value;
  
  value._M_elems[0] = _x;
  value._M_elems[1] = _y;
  value._M_elems[2] = _z;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
            ::operator[](&this->data,_name);
  UniformData::set(this_00,&value,3,false,true);
  this->m_change = true;
  return;
}

Assistant:

void Uniforms::set(const std::string& _name, float _x, float _y, float _z) {
    UniformValue value;
    value[0] = _x;
    value[1] = _y;
    value[2] = _z;
    data[_name].set(value, 3, false);
    m_change = true;
}